

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_7::Validator::OnReturnCallExpr(Validator *this,ReturnCallExpr *expr)

{
  Result RVar1;
  Func *in_RAX;
  Func *local_18;
  Func *callee;
  
  this->expr_loc_ = &(expr->super_ExprMixin<(wabt::ExprType)32>).super_Expr.loc;
  local_18 = in_RAX;
  RVar1 = CheckFuncVar(this,&expr->var,&local_18);
  if (RVar1.enum_ == Ok) {
    TypeChecker::OnReturnCall
              (&this->typechecker_,&(local_18->decl).sig.param_types,
               &(local_18->decl).sig.result_types);
  }
  return (Result)Ok;
}

Assistant:

Result Validator::OnReturnCallExpr(ReturnCallExpr* expr) {
  expr_loc_ = &expr->loc;
  const Func* callee;
  if (Succeeded(CheckFuncVar(&expr->var, &callee))) {
    typechecker_.OnReturnCall(callee->decl.sig.param_types,
                        callee->decl.sig.result_types);
  }
  return Result::Ok;
}